

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

int tele(char *msg)

{
  boolean bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  monst *local_148;
  char local_128 [8];
  char buf [256];
  coord local_1a;
  char *pcStack_18;
  coord cc;
  char *msg_local;
  
  pcStack_18 = msg;
  if (((*(uint *)&(level->flags).field_0x8 >> 0xb & 1) != 0) && (flags.debug == '\0')) {
    pline("A mysterious force prevents you from teleporting!");
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    make_blinded(0,'\0');
  }
  if (((((u.uhave._0_1_ & 1) != 0) || (bVar1 = On_W_tower_level(&u.uz), bVar1 != '\0')) ||
      ((u.usteed != (monst *)0x0 && (iVar3 = mon_has_amulet(u.usteed), iVar3 != 0)))) &&
     (flags.debug == '\0')) {
    pline("You feel disoriented for a moment.");
    return 1;
  }
  if ((((((u.uprops[0xf].intrinsic != 0) || (u.uprops[0xf].extrinsic != 0)) ||
        (((youmonst.data)->mflags1 & 0x4000000) != 0)) &&
       ((u.uprops[0x1b].intrinsic == 0 && (u.umonnum != 0x9e)))) &&
      ((youmonst.data)->mlet != '\x1c')) || (flags.debug != '\0')) {
    bVar1 = unconscious();
    if (bVar1 == '\0') {
      if (u.usteed != (monst *)0x0) {
        pcVar4 = mon_nam(u.usteed);
        sprintf(local_128," and %s",pcVar4);
      }
      pline("To what position do you%s want to be teleported?");
      local_1a.x = u.ux;
      local_1a.y = u.uy;
      iVar3 = getpos(&local_1a,'\0',"the desired position");
      if (iVar3 < 0) {
        return 0;
      }
      bVar1 = teleok((int)local_1a.x,(int)local_1a.y,'\0');
      if (bVar1 != '\0') {
LAB_002f8462:
        teleds((int)local_1a.x,(int)local_1a.y,'\0');
        return 1;
      }
      if (flags.debug != '\0') {
        bVar5 = false;
        if ((('\0' < local_1a.x) && (bVar5 = false, local_1a.x < 'P')) &&
           ((bVar5 = false, -1 < local_1a.y && (bVar5 = false, local_1a.y < '\x15')))) {
          if ((level->monsters[local_1a.x][local_1a.y] == (monst *)0x0) ||
             ((*(uint *)&level->monsters[local_1a.x][local_1a.y]->field_0x60 >> 9 & 1) != 0)) {
            local_148 = (monst *)0x0;
          }
          else {
            local_148 = level->monsters[local_1a.x][local_1a.y];
          }
          bVar5 = local_148 != (monst *)0x0;
        }
        pcVar4 = "Force teleport?";
        if (bVar5) {
          pcVar4 = "Force teleport? (monster blocking)";
        }
        cVar2 = yn_function(pcVar4,"yn",'n');
        if (cVar2 == 'y') goto LAB_002f8462;
      }
      pline("Sorry...");
    }
    else {
      pline("Being unconscious, you cannot control your teleport.");
    }
  }
  local_1a.x = u.ux;
  local_1a.y = u.uy;
  safe_teleds('\0');
  if ((u.ux != local_1a.x) || (u.uy != local_1a.y)) {
    if (pcStack_18 == (char *)0x0) {
      if (flags.verbose != '\0') {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pline("Your surroundings suddenly seem different.");
        }
        else {
          pcVar4 = surface((int)local_1a.x,(int)local_1a.y);
          pline("The %s under you seems different from before.",pcVar4);
        }
      }
    }
    else if (*pcStack_18 != '\0') {
      pline(pcStack_18);
    }
  }
  return 1;
}

Assistant:

int tele(const char *msg)
{
	coord cc;

	/* Disable teleportation in stronghold && Vlad's Tower */
	if (level->flags.noteleport) {
		if (!wizard) {
		    pline("A mysterious force prevents you from teleporting!");
		    return 1;
		}
	}

	/* don't show trap if "Sorry..." */
	if (!Blinded) make_blinded(0L,FALSE);

	if ((u.uhave.amulet || On_W_tower_level(&u.uz) ||
	     (u.usteed && mon_has_amulet(u.usteed))) &&
	    !wizard) {
	    pline("You feel disoriented for a moment.");
	    return 1;
	}
	if ((Teleport_control && !Stunned) || wizard) {
	    if (unconscious()) {
		pline("Being unconscious, you cannot control your teleport.");
	    } else {
		    char buf[BUFSZ];
		    if (u.usteed)
			    sprintf(buf," and %s", mon_nam(u.usteed));
		    pline("To what position do you%s want to be teleported?",
				u.usteed ? buf : "");
		    cc.x = u.ux;
		    cc.y = u.uy;
		    if (getpos(&cc, FALSE, "the desired position") < 0)
			return 0;	/* abort */
		    /* possible extensions: introduce a small error if
		       magic power is low; allow transfer to solid rock */
		    if (teleok(cc.x, cc.y, FALSE) ||
			(wizard &&
			 yn((isok(cc.x, cc.y) && m_at(level, cc.x, cc.y)) ?
			    "Force teleport? (monster blocking)" :
			    "Force teleport?") == 'y')) {
			teleds(cc.x, cc.y, FALSE);
			return 1;
		    }
		    pline("Sorry...");
		}
	}

	cc.x = u.ux;
	cc.y = u.uy;
	safe_teleds(FALSE);
	if (u.ux != cc.x || u.uy != cc.y) {
	    if (msg == NULL) {
		if (flags.verbose) {
		    if (Blind) {
			pline("The %s under you seems different from before.",
			      surface(cc.x, cc.y));
		    } else {
			pline("Your surroundings suddenly seem different.");
		    }
		}
	    } else if (msg[0] != '\0') {
		pline(msg);
	    }
	}
	return 1;
}